

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * declaration_list(dmr_C *C,token *token,symbol_list **list)

{
  int iVar1;
  unsigned_long uVar2;
  symbol *sym;
  token *token_00;
  symbol *decl;
  unsigned_long mod;
  ctype saved;
  decl_state ctx;
  symbol_list **list_local;
  token *token_local;
  dmr_C *C_local;
  
  memset(&saved.base_type,0,0x40);
  list_local = (symbol_list **)declaration_specifiers(C,token,(decl_state *)&saved.base_type);
  uVar2 = storage_modifiers(C,(decl_state *)&saved.base_type);
  memcpy(&mod,&saved.base_type,0x28);
  while( true ) {
    sym = dmrC_alloc_symbol(C->S,(position)*list_local,3);
    list_local = (symbol_list **)declarator(C,(token *)list_local,(decl_state *)&saved.base_type);
    iVar1 = dmrC_match_op((token *)list_local,0x3a);
    if (iVar1 != 0) {
      list_local = (symbol_list **)
                   handle_bitfield(C,(token *)list_local,(decl_state *)&saved.base_type);
    }
    token_00 = handle_attributes(C,(token *)list_local,(decl_state *)&saved.base_type,8);
    apply_modifiers(C,token_00->pos,(decl_state *)&saved.base_type);
    memcpy((void *)((long)&sym->field_14 + 0x18),&saved.base_type,0x28);
    (sym->field_14).field_2.ctype.modifiers = uVar2 | (sym->field_14).field_2.ctype.modifiers;
    sym->endpos = token_00->pos;
    dmrC_add_symbol(C,list,sym);
    iVar1 = dmrC_match_op(token_00,0x2c);
    if (iVar1 == 0) break;
    list_local = (symbol_list **)token_00->next;
    memcpy(&saved.base_type,&mod,0x28);
  }
  return token_00;
}

Assistant:

static struct token *declaration_list(struct dmr_C *C, struct token *token, struct symbol_list **list)
{
	struct decl_state ctx = {.prefer_abstract = 0};
	struct ctype saved;
	unsigned long mod;

	token = declaration_specifiers(C, token, &ctx);
	mod = storage_modifiers(C, &ctx);
	saved = ctx.ctype;
	for (;;) {
		struct symbol *decl = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		ctx.ident = &decl->ident;

		token = declarator(C, token, &ctx);
		if (dmrC_match_op(token, ':'))
			token = handle_bitfield(C, token, &ctx);

		token = handle_attributes(C, token, &ctx, KW_ATTRIBUTE);
		apply_modifiers(C, token->pos, &ctx);

		decl->ctype = ctx.ctype;
		decl->ctype.modifiers |= mod;
		decl->endpos = token->pos;
		dmrC_add_symbol(C, list, decl);
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
		ctx.ctype = saved;
	}
	return token;
}